

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_umin_i32_ppc(TCGContext_conflict9 *tcg_ctx,TCGv_i32 ret,TCGv_i32 a,TCGv_i32 b)

{
  tcg_gen_movcond_i32_ppc(tcg_ctx,TCG_COND_LTU,ret,a,b,a,b);
  return;
}

Assistant:

void tcg_gen_umin_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 a, TCGv_i32 b)
{
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LTU, ret, a, b, a, b);
}